

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O3

bool __thiscall
opts::BasicOption::parse(BasicOption *this,int argc,char **argv,int *i,int j,IsShort *is_short)

{
  char *__s;
  bool bVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  long *plVar6;
  char *pcVar7;
  allocator<char> local_71;
  long *local_70 [2];
  long local_60 [2];
  _Any_data local_50;
  code *local_40;
  
  lVar5 = (long)*i;
  __s = argv[lVar5];
  pcVar7 = __s + j;
  if (__s[j] == '=') {
    pcVar7 = pcVar7 + 1;
  }
  else if (__s[j] == '\0') {
    lVar3 = lVar5 + 1;
    if (argc <= (int)lVar3) {
LAB_0010715f:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: cannot find the argument; ignoring ",0x2a);
      pcVar7 = argv[*i];
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x141500);
      }
      else {
        sVar4 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar4);
      }
      plVar6 = &std::cerr;
      goto LAB_001072d5;
    }
    pcVar7 = argv[lVar5 + 1];
    if (*pcVar7 == '-') {
      std::function<bool_(char)>::function((function<bool_(char)> *)&local_50,is_short);
      bVar1 = Options::dashed_non_option(pcVar7,(IsShort *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      if (!bVar1) goto LAB_0010715f;
      lVar3 = (long)*i + 1;
    }
    *i = (int)lVar3;
    pcVar7 = argv[lVar3];
  }
  else if (j != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: unexpected character \'",0x1d);
    local_71 = *(allocator<char> *)(argv[*i] + j);
    plVar6 = (long *)std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)&local_71,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar6,"\' ignoring ",0xb);
    pcVar7 = argv[*i];
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)plVar6 + (int)*(undefined8 *)(*plVar6 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar6,pcVar7,sVar4);
    }
    goto LAB_001072d5;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar7,&local_71);
  iVar2 = (*this->_vptr_BasicOption[4])(this,local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((char)iVar2 != '\0') {
    return true;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"error: failed to parse ",0x17);
  if (pcVar7 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x141500);
  }
  else {
    sVar4 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
  sVar4 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar4);
  plVar6 = &std::cerr;
LAB_001072d5:
  local_71 = (allocator<char>)0xa;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar6,(char *)&local_71,1);
  return false;
}

Assistant:

bool
BasicOption::parse(int argc, char** argv, int& i, int j, IsShort is_short)
{
    char* argument;
    char* cur_arg = argv[i];
    // -v...
    if (argv[i][j] == '\0')
    {
        // -v data
        if (i + 1 < argc && (argv[i+1][0] != '-' || Options::dashed_non_option(argv[i+1], is_short)))
        {
            ++i;
            argument = argv[i];
        } else
        {
            std::cerr << "error: cannot find the argument; ignoring " << argv[i] << '\n';
            return false;
        }
    } else if (argv[i][j] == '=')
    {
        // -v=data
        argument = &argv[i][j+1];
    } else if( j == 2 ) { // only for short options
        // -vdata
        argument = &argv[i][j];
    } else
    {
        std::cerr << "error: unexpected character \'" << argv[i][j] << "\' ignoring " << argv[i] << '\n';
        return false;
    }
    bool result = set(argument);
    if (!result)
        std::cerr << "error: failed to parse " << argument << " in " << cur_arg << '\n';
    return result;
}